

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O1

void Ivy_NodeComputeVolume2(Ivy_Obj_t *pObj,int nNodeLimit,Vec_Ptr_t *vNodes,Vec_Ptr_t *vFront)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x11a,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  vNodes->nSize = 0;
  vFront->nSize = 0;
  pObj->field_0x8 = pObj->field_0x8 | 0x10;
  uVar11 = vNodes->nCap;
  if (vNodes->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar4;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar11 * 2;
      if (iVar8 <= (int)uVar11) goto LAB_0074b21e;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar11 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar11 << 4);
      }
      vNodes->pArray = ppvVar4;
    }
    vNodes->nCap = iVar8;
  }
LAB_0074b21e:
  iVar8 = vNodes->nSize;
  vNodes->nSize = iVar8 + 1;
  vNodes->pArray[iVar8] = pObj;
  uVar11 = vFront->nCap;
  if (vFront->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vFront->pArray,0x80);
      }
      vFront->pArray = ppvVar4;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar11 * 2;
      if (iVar8 <= (int)uVar11) goto LAB_0074b29b;
      if (vFront->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar11 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar11 << 4);
      }
      vFront->pArray = ppvVar4;
    }
    vFront->nCap = iVar8;
  }
LAB_0074b29b:
  iVar8 = vFront->nSize;
  vFront->nSize = iVar8 + 1;
  vFront->pArray[iVar8] = pObj;
  uVar11 = *(uint *)&pObj->field_0x8 >> 0xb;
  do {
    uVar2 = vFront->nSize;
    uVar6 = (ulong)uVar2;
    do {
      if ((int)uVar6 < 1) {
        pvVar9 = (void *)0x0;
        break;
      }
      pvVar9 = vFront->pArray[uVar6 - 1];
      uVar6 = uVar6 - 1;
    } while (*(uint *)((long)pvVar9 + 8) >> 0xb != uVar11);
    if (pvVar9 == (void *)0x0) {
      uVar11 = uVar11 - 1;
      if (uVar11 == 0) break;
    }
    else {
      lVar5 = (ulong)uVar2 + 1;
      do {
        if ((int)lVar5 + -1 < 1) {
          __assert_fail("i >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
        }
        lVar7 = lVar5 + -1;
        lVar3 = lVar5 + -2;
        lVar5 = lVar7;
      } while (vFront->pArray[lVar3] != pvVar9);
      for (; (int)lVar7 < (int)uVar2; lVar7 = lVar7 + 1) {
        vFront->pArray[lVar7 + -1] = vFront->pArray[lVar7];
      }
      vFront->nSize = uVar2 - 1;
      pvVar10 = (void *)(*(ulong *)((long)pvVar9 + 0x10) & 0xfffffffffffffffe);
      if ((*(uint *)((long)pvVar10 + 8) & 0x10) == 0) {
        *(uint *)((long)pvVar10 + 8) = *(uint *)((long)pvVar10 + 8) | 0x10;
        uVar2 = vNodes->nCap;
        if (vNodes->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0074b3a9;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar4;
          vNodes->nCap = iVar8;
        }
LAB_0074b3a9:
        iVar8 = vNodes->nSize;
        vNodes->nSize = iVar8 + 1;
        vNodes->pArray[iVar8] = pvVar10;
        uVar2 = vFront->nCap;
        if (vFront->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vFront->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vFront->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0074b418;
            if (vFront->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar2 << 4);
            }
          }
          vFront->pArray = ppvVar4;
          vFront->nCap = iVar8;
        }
LAB_0074b418:
        iVar8 = vFront->nSize;
        vFront->nSize = iVar8 + 1;
        vFront->pArray[iVar8] = pvVar10;
      }
      pvVar9 = (void *)(*(ulong *)((long)pvVar9 + 0x18) & 0xfffffffffffffffe);
      if ((pvVar9 != (void *)0x0) && ((*(uint *)((long)pvVar9 + 8) & 0x10) == 0)) {
        *(uint *)((long)pvVar9 + 8) = *(uint *)((long)pvVar9 + 8) | 0x10;
        uVar2 = vNodes->nCap;
        if (vNodes->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0074b4b4;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
            }
          }
          vNodes->pArray = ppvVar4;
          vNodes->nCap = iVar8;
        }
LAB_0074b4b4:
        iVar8 = vNodes->nSize;
        vNodes->nSize = iVar8 + 1;
        vNodes->pArray[iVar8] = pvVar9;
        uVar2 = vFront->nCap;
        if (vFront->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (vFront->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(vFront->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0074b523;
            if (vFront->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(vFront->pArray,(ulong)uVar2 << 4);
            }
          }
          vFront->pArray = ppvVar4;
          vFront->nCap = iVar8;
        }
LAB_0074b523:
        iVar8 = vFront->nSize;
        vFront->nSize = iVar8 + 1;
        vFront->pArray[iVar8] = pvVar9;
      }
    }
  } while (vNodes->nSize < nNodeLimit);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Ivy_CompareNodesByLevel);
  }
  if ((long)vNodes->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (*(uint *)((long)vNodes->pArray[(long)vNodes->nSize + -1] + 8) >> 0xb <
      *(uint *)((long)*vNodes->pArray + 8) >> 0xb) {
    __assert_fail("pFanin->Level <= pPivot->Level",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x150,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (0 < vNodes->nSize) {
    lVar5 = 0;
    do {
      pvVar9 = vNodes->pArray[lVar5];
      puVar1 = (uint *)((long)pvVar9 + 8);
      *puVar1 = *puVar1 & 0xffffffef;
      *(int *)((long)pvVar9 + 4) = (int)lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vNodes->nSize);
  }
  return;
}

Assistant:

void Ivy_NodeComputeVolume2( Ivy_Obj_t * pObj, int nNodeLimit, Vec_Ptr_t * vNodes, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pLeaf, * pPivot, * pFanin;
    int LevelMax, i;
    assert( Ivy_ObjIsNode(pObj) );
    // clear arrays
    Vec_PtrClear( vNodes );
    Vec_PtrClear( vFront );
    // add the root
    pObj->fMarkA = 1;
    Vec_PtrPush( vNodes, pObj );
    Vec_PtrPush( vFront, pObj );
    // expand node with maximum level
    LevelMax = pObj->Level;
    do {
        // get the node to expand
        pPivot = NULL;
        Vec_PtrForEachEntryReverse( Ivy_Obj_t *, vFront, pLeaf, i )
        {
            if ( (int)pLeaf->Level == LevelMax )
            {
                pPivot = pLeaf;
                break;
            }
        }
        // decrease level if we did not find the node
        if ( pPivot == NULL )
        {
            if ( --LevelMax == 0 )
                break;
            continue;
        }
        // the node to expand is found
        // remove it from frontier
        Vec_PtrRemove( vFront, pPivot );
        // add fanins
        pFanin = Ivy_ObjFanin0(pPivot); 
        if ( !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        pFanin = Ivy_ObjFanin1(pPivot); 
        if ( pFanin && !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        // quit if we collected enough nodes
    } while ( Vec_PtrSize(vNodes) < nNodeLimit );

    // sort nodes by level
    Vec_PtrSort( vNodes, (int (*)(void))Ivy_CompareNodesByLevel );
    // make sure the nodes are ordered in the increasing number of levels
    pFanin = (Ivy_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    pPivot = (Ivy_Obj_t *)Vec_PtrEntryLast( vNodes );
    assert( pFanin->Level <= pPivot->Level );

    // clean the marks and remember node numbers in the TravId
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pFanin, i )
    {
        pFanin->fMarkA = 0;
        pFanin->TravId = i;
    }
}